

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int __thiscall ncnn::CpuSet::num_enabled(CpuSet *this)

{
  bool bVar1;
  CpuSet *in_RDI;
  int i;
  int num_enabled;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0;
  for (local_10 = 0; local_10 < 0x400; local_10 = local_10 + 1) {
    bVar1 = is_enabled(in_RDI,local_10);
    if (bVar1) {
      local_c = local_c + 1;
    }
  }
  return local_c;
}

Assistant:

int CpuSet::num_enabled() const
{
    int num_enabled = 0;
    for (int i = 0; i < (int)sizeof(cpu_set_t) * 8; i++)
    {
        if (is_enabled(i))
            num_enabled++;
    }

    return num_enabled;
}